

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreParsingUtils.h
# Opt level: O1

string * Assimp::Ogre::Trim(string *s,bool newlines)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  
  pbVar2 = (byte *)(s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  pbVar1 = pbVar2 + uVar3;
  pbVar5 = pbVar2;
  if (0 < (long)uVar3 >> 2) {
    pbVar5 = pbVar2 + (uVar3 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar3 >> 2) + 1;
    pbVar4 = pbVar2 + 3;
    do {
      if ((0x20 < (ulong)pbVar4[-3]) || ((0x100003601U >> ((ulong)pbVar4[-3] & 0x3f) & 1) == 0)) {
        pbVar4 = pbVar4 + -3;
        goto LAB_004c3eb8;
      }
      if ((0x20 < (ulong)pbVar4[-2]) || ((0x100003601U >> ((ulong)pbVar4[-2] & 0x3f) & 1) == 0)) {
        pbVar4 = pbVar4 + -2;
        goto LAB_004c3eb8;
      }
      if ((0x20 < (ulong)pbVar4[-1]) || ((0x100003601U >> ((ulong)pbVar4[-1] & 0x3f) & 1) == 0)) {
        pbVar4 = pbVar4 + -1;
        goto LAB_004c3eb8;
      }
      if ((0x20 < (ulong)*pbVar4) || ((0x100003601U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
      goto LAB_004c3eb8;
      lVar6 = lVar6 + -1;
      pbVar4 = pbVar4 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pbVar1 - (long)pbVar5;
  pbVar4 = pbVar1;
  if (lVar6 == 1) {
LAB_004c3e88:
    if ((0x20 < (ulong)*pbVar5) || ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
    goto LAB_004c3ea4;
  }
  else {
    if (lVar6 == 2) {
LAB_004c3e6c:
      if (((ulong)*pbVar5 < 0x21) && ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0)) {
        pbVar5 = pbVar5 + 1;
        goto LAB_004c3e88;
      }
    }
    else {
      if (lVar6 != 3) goto LAB_004c3eb8;
      if (((ulong)*pbVar5 < 0x21) && ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0)) {
        pbVar5 = pbVar5 + 1;
        goto LAB_004c3e6c;
      }
    }
LAB_004c3ea4:
    pbVar4 = pbVar5;
  }
LAB_004c3eb8:
  if (pbVar1 == pbVar4) {
    s->_M_string_length = 0;
    *pbVar2 = 0;
  }
  else {
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  pbVar2 = (byte *)(s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  pbVar1 = pbVar2 + uVar3;
  pbVar5 = pbVar2;
  if (0 < (long)uVar3 >> 2) {
    pbVar5 = pbVar2 + (uVar3 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar3 >> 2) + 1;
    pbVar4 = pbVar2 + 3;
    do {
      if ((0x20 < (ulong)pbVar4[-3]) || ((0x100003601U >> ((ulong)pbVar4[-3] & 0x3f) & 1) == 0)) {
        pbVar4 = pbVar4 + -3;
        goto LAB_004c4003;
      }
      if ((0x20 < (ulong)pbVar4[-2]) || ((0x100003601U >> ((ulong)pbVar4[-2] & 0x3f) & 1) == 0)) {
        pbVar4 = pbVar4 + -2;
        goto LAB_004c4003;
      }
      if ((0x20 < (ulong)pbVar4[-1]) || ((0x100003601U >> ((ulong)pbVar4[-1] & 0x3f) & 1) == 0)) {
        pbVar4 = pbVar4 + -1;
        goto LAB_004c4003;
      }
      if ((0x20 < (ulong)*pbVar4) || ((0x100003601U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
      goto LAB_004c4003;
      lVar6 = lVar6 + -1;
      pbVar4 = pbVar4 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pbVar1 - (long)pbVar5;
  pbVar4 = pbVar1;
  if (lVar6 == 1) {
LAB_004c3fd3:
    if (((ulong)*pbVar5 < 0x21) && ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))
    goto LAB_004c4003;
  }
  else if (lVar6 == 2) {
LAB_004c3fb7:
    if (((ulong)*pbVar5 < 0x21) && ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0)) {
      pbVar5 = pbVar5 + 1;
      goto LAB_004c3fd3;
    }
  }
  else {
    if (lVar6 != 3) goto LAB_004c4003;
    if (((ulong)*pbVar5 < 0x21) && ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0)) {
      pbVar5 = pbVar5 + 1;
      goto LAB_004c3fb7;
    }
  }
  pbVar4 = pbVar5;
LAB_004c4003:
  if (pbVar1 == pbVar4) {
    s->_M_string_length = 0;
    *pbVar2 = 0;
  }
  else {
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  return s;
}

Assistant:

static AI_FORCE_INLINE
std::string &Trim(std::string &s, bool newlines = true) {
    return TrimLeft(TrimRight(s, newlines), newlines);
}